

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dict.c
# Opt level: O3

void lydict_clean(ly_dict *dict)

{
  int *piVar1;
  uint32_t uVar2;
  ly_ht *ht;
  uchar *puVar3;
  ulong uVar4;
  
  if (dict != (ly_dict *)0x0) {
    ht = dict->hash_tab;
    if (ht->size != 0) {
      uVar4 = 0;
      do {
        uVar2 = ht->hlists[uVar4].first;
        if (uVar2 != 0xffffffff) {
          puVar3 = ht->recs + uVar2 * ht->rec_size;
          do {
            ly_log((ly_ctx *)0x0,LY_LLWRN,LY_SUCCESS,
                   "String \"%s\" not freed from the dictionary, refcount %u.",
                   *(undefined8 *)(puVar3 + 8),(ulong)*(uint *)(puVar3 + 0x10));
            piVar1 = (int *)(puVar3 + 4);
            ht = dict->hash_tab;
            puVar3 = ht->recs + (uint)ht->rec_size * *piVar1;
          } while (*piVar1 != -1);
        }
        uVar4 = uVar4 + 1;
      } while (uVar4 < ht->size);
    }
    lyht_free(ht,(_func_void_void_ptr *)0x0);
    pthread_mutex_destroy((pthread_mutex_t *)&dict->lock);
    return;
  }
  ly_log((ly_ctx *)0x0,LY_LLERR,LY_EINVAL,"Invalid argument %s (%s()).","dict","lydict_clean");
  return;
}

Assistant:

void
lydict_clean(struct ly_dict *dict)
{
    struct ly_dict_rec *dict_rec = NULL;
    struct ly_ht_rec *rec = NULL;
    uint32_t hlist_idx;
    uint32_t rec_idx;

    LY_CHECK_ARG_RET(NULL, dict, );

    LYHT_ITER_ALL_RECS(dict->hash_tab, hlist_idx, rec_idx, rec) {
        /*
         * this should not happen, all records inserted into
         * dictionary are supposed to be removed using lydict_remove()
         * before calling lydict_clean()
         */
        dict_rec = (struct ly_dict_rec *)rec->val;
        LOGWRN(NULL, "String \"%s\" not freed from the dictionary, refcount %" PRIu32 ".", dict_rec->value, dict_rec->refcount);
        /* if record wasn't removed before free string allocated for that record */
#ifdef NDEBUG
        free(dict_rec->value);
#endif
    }

    /* free table and destroy mutex */
    lyht_free(dict->hash_tab, NULL);
    pthread_mutex_destroy(&dict->lock);
}